

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

qint64 __thiscall QProcess::readData(QProcess *this,char *data,qint64 maxlen)

{
  QProcessPrivate *pQVar1;
  long in_RDX;
  QProcessPrivate *d;
  qint64 local_8;
  
  pQVar1 = d_func((QProcess *)0x791981);
  if (in_RDX == 0) {
    local_8 = 0;
  }
  else if (pQVar1->processState == '\0') {
    local_8 = -1;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

qint64 QProcess::readData(char *data, qint64 maxlen)
{
    Q_D(QProcess);
    Q_UNUSED(data);
    if (!maxlen)
        return 0;
    if (d->processState == QProcess::NotRunning)
        return -1;              // EOF
    return 0;
}